

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O0

void __thiscall
estl::vector_s<unsigned_int,_5UL>::vector_s
          (vector_s<unsigned_int,_5UL> *this,size_type count,uint *value)

{
  size_type sVar1;
  range_error *this_00;
  pointer insert_ptr;
  size_t i;
  uint *value_local;
  size_type count_local;
  vector_s<unsigned_int,_5UL> *this_local;
  
  this->size_ = 0;
  this->data_ptr_ = (pointer)this->data_;
  sVar1 = capacity(this);
  insert_ptr = (pointer)count;
  if (count <= sVar1) {
    while (insert_ptr != (pointer)0x0) {
      insert_ptr = (pointer)((long)insert_ptr + -1);
      this->data_ptr_[(long)insert_ptr] = *value;
    }
    this->size_ = count;
    return;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this_00,"cas::vector_s constructing beyond capacity.");
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

vector_s(size_type count, const T& value)
    {
        if (count > capacity()) {
            ESTL_THROW(std::range_error, "cas::vector_s constructing beyond capacity.");
        }
        for (size_t i = count; i > 0; ) {
            --i;
            const pointer insert_ptr = data_ptr_ + i;
            new (insert_ptr) value_type(value);
        }
        size_ = count;
    }